

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *focus_window;
  ImGuiWindow *window;
  int local_28;
  int i;
  int offset;
  int start_idx;
  ImGuiContext *g;
  ImGuiWindow *ignore_window_local;
  ImGuiWindow *under_this_window_local;
  
  pIVar1 = GImGui;
  i = (GImGui->WindowsFocusOrder).Size + -1;
  if (under_this_window != (ImGuiWindow *)0x0) {
    local_28 = -1;
    ignore_window_local = under_this_window;
    while ((ignore_window_local->Flags & 0x1000000U) != 0) {
      ignore_window_local = ignore_window_local->ParentWindow;
      local_28 = 0;
    }
    iVar2 = FindWindowFocusIndex(ignore_window_local);
    i = iVar2 + local_28;
  }
  window._4_4_ = i;
  while( true ) {
    if (window._4_4_ < 0) {
      FocusWindow((ImGuiWindow *)0x0);
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,window._4_4_);
    pIVar4 = *ppIVar3;
    if (pIVar4 != pIVar4->RootWindow) break;
    if (((pIVar4 != ignore_window) && ((pIVar4->WasActive & 1U) != 0)) &&
       ((pIVar4->Flags & 0x40200U) != 0x40200)) {
      pIVar4 = NavRestoreLastChildNavWindow(pIVar4);
      FocusWindow(pIVar4);
      return;
    }
    window._4_4_ = window._4_4_ + -1;
  }
  __assert_fail("window == window->RootWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x1cc5,"void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *, ImGuiWindow *)");
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        // Aim at root window behind us, if we are in a child window that's our own root (see #4640)
        int offset = -1;
        while (under_this_window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            under_this_window = under_this_window->ParentWindow;
            offset = 0;
        }
        start_idx = FindWindowFocusIndex(under_this_window) + offset;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                // FIXME-DOCK: This is failing (lagging by one frame) for docked windows.
                // If A and B are docked into window and B disappear, at the NewFrame() call site window->NavLastChildNavWindow will still point to B.
                // We might leverage the tab order implicitly stored in window->DockNodeAsHost->TabBar (essentially the 'most_recently_selected_tab' code in tab bar will do that but on next update)
                // to tell which is the "previous" window. Or we may leverage 'LastFrameFocused/LastFrameJustFocused' and have this function handle child window itself?
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}